

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPN::Mix(OPN *this,Sample *buffer,int nsamples)

{
  undefined1 *this_00;
  undefined1 *this_01;
  short *psVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ISample IVar5;
  Sample *dest;
  uint uVar6;
  
  PSG::Mix(&(this->super_OPNBase).psg,buffer,nsamples);
  this_00 = &this->field_0x1d8;
  Channel4::SetFNum((Channel4 *)this_00,this->fnum[0]);
  this_01 = &this->field_0x4b8;
  Channel4::SetFNum((Channel4 *)this_01,this->fnum[1]);
  if ((this->super_OPNBase).super_Timer.regtc < 0x40) {
    Channel4::SetFNum((Channel4 *)&this->field_0x798,this->fnum[2]);
  }
  else {
    Operator::SetFNum((Operator *)&this->field_0x7f8,this->fnum3[1]);
    Operator::SetFNum((Operator *)&this->field_0x898,this->fnum3[2]);
    Operator::SetFNum((Operator *)&this->field_0x938,this->fnum3[0]);
    Operator::SetFNum((Operator *)&this->field_0x9d8,this->fnum[2]);
  }
  iVar2 = Channel4::Prepare((Channel4 *)&this->field_0x798);
  iVar3 = Channel4::Prepare((Channel4 *)this_01);
  uVar4 = Channel4::Prepare((Channel4 *)this_00);
  uVar6 = iVar3 << 2 | iVar2 << 4 | uVar4;
  if ((uVar6 & 0x15) != 0) {
    psVar1 = buffer + nsamples * 2;
    for (; buffer < psVar1; buffer = buffer + 2) {
      iVar2 = 0;
      if ((uVar4 & 1) != 0) {
        iVar2 = Channel4::Calc((Channel4 *)this_00);
      }
      if ((uVar6 & 4) != 0) {
        IVar5 = Channel4::Calc((Channel4 *)this_01);
        iVar2 = iVar2 + IVar5;
      }
      if ((uVar6 & 0x10) != 0) {
        IVar5 = Channel4::Calc((Channel4 *)&this->field_0x798);
        iVar2 = iVar2 + IVar5;
      }
      if (iVar2 < -0x7fff) {
        iVar2 = -0x8000;
      }
      if (0x7ffe < iVar2) {
        iVar2 = 0x7fff;
      }
      iVar3 = iVar2 * (this->super_OPNBase).fmvolume >> 0xe;
      iVar2 = *buffer + iVar3;
      if (iVar2 < -0x7fff) {
        iVar2 = -0x8000;
      }
      if (0x7ffe < iVar2) {
        iVar2 = 0x7fff;
      }
      *buffer = (short)iVar2;
      iVar3 = iVar3 + buffer[1];
      if (iVar3 < -0x7fff) {
        iVar3 = -0x8000;
      }
      if (0x7ffe < iVar3) {
        iVar3 = 0x7fff;
      }
      buffer[1] = (short)iVar3;
    }
  }
  return;
}

Assistant:

void OPN::Mix(Sample* buffer, int nsamples)
{
//printf("M:%d\n",nsamples);
#define IStoSample(s)	((Limit(s, 0x7fff, -0x8000) * fmvolume) >> 14)

	psg.Mix(buffer, nsamples);

	// Set F-Number
	ch[0].SetFNum(fnum[0]);
	ch[1].SetFNum(fnum[1]);
	if (!(regtc & 0xc0))
		ch[2].SetFNum(fnum[2]);
	else
	{	// ���ʉ�
		ch[2].op[0].SetFNum(fnum3[1]);
		ch[2].op[1].SetFNum(fnum3[2]);
		ch[2].op[2].SetFNum(fnum3[0]);
		ch[2].op[3].SetFNum(fnum[2]);
	}

	int actch = (((ch[2].Prepare() << 2) | ch[1].Prepare()) << 2) | ch[0].Prepare();
//printf("a %X\n",actch);
	if (actch & 0x15)
	{
		Sample* limit = buffer + nsamples * 2;
		for (Sample* dest = buffer; dest < limit; dest+=2)
		{
			ISample s = 0;
			if (actch & 0x01) s  = ch[0].Calc();
			if (actch & 0x04) s += ch[1].Calc();
			if (actch & 0x10) s += ch[2].Calc();
			s = IStoSample(s);
			StoreSample(dest[0], s);
			StoreSample(dest[1], s);
//printf("%08X,%08X\n",dest[0],dest[1]);
		}
	}
#undef IStoSample
}